

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canlogserver.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>+\n",in_RDI);
  fprintf(_stderr,"  (use CTRL-C to terminate %s)\n\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -m <mask>   (ID filter mask.  Default 0x00000000) *\n");
  fprintf(_stderr,"         -v <value>  (ID filter value. Default 0x00000000) *\n");
  fprintf(_stderr,"         -i <0|1>    (invert the specified ID filter) *\n");
  fprintf(_stderr,"         -e <emask>  (mask for error frames)\n");
  fprintf(_stderr,"         -p <port>   (listen on port <port>. Default: %d)\n",0x701c);
  fprintf(_stderr,"\n");
  fprintf(_stderr,"* The CAN ID filter matches, when ...\n");
  fprintf(_stderr,"       <received_can_id> & mask == value & mask\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"When using more than one CAN interface the options\n");
  fprintf(_stderr,"m/v/i/e have comma separated values e.g. \'-m 0,7FF,0\'\n");
  fprintf(_stderr,"\nUse interface name \'%s\' to receive from all CAN interfaces.\n\n","any");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>+\n", prg);
	fprintf(stderr, "  (use CTRL-C to terminate %s)\n\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -m <mask>   (ID filter mask.  Default 0x00000000) *\n");
	fprintf(stderr, "         -v <value>  (ID filter value. Default 0x00000000) *\n");
	fprintf(stderr, "         -i <0|1>    (invert the specified ID filter) *\n");
	fprintf(stderr, "         -e <emask>  (mask for error frames)\n");
	fprintf(stderr, "         -p <port>   (listen on port <port>. Default: %d)\n", DEFPORT);
	fprintf(stderr, "\n");
	fprintf(stderr, "* The CAN ID filter matches, when ...\n");
	fprintf(stderr, "       <received_can_id> & mask == value & mask\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "When using more than one CAN interface the options\n");
	fprintf(stderr, "m/v/i/e have comma separated values e.g. '-m 0,7FF,0'\n");
	fprintf(stderr, "\nUse interface name '%s' to receive from all CAN interfaces.\n\n", ANYDEV);
}